

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O3

void Cut_OracleFreeCuts(Cut_Oracle_t *p,int Node)

{
  char *pcVar1;
  char *pcVar2;
  char *pEntry;
  
  if (-1 < Node) {
    if (Node < p->vCutsNew->nSize) {
      pcVar1 = (char *)p->vCutsNew->pArray[(uint)Node];
      pEntry = pcVar1;
      if (pcVar1 != (char *)0x0) {
        do {
          pcVar2 = *(char **)(pEntry + 0x10);
          Extra_MmFixedEntryRecycle(p->pMmCuts,pEntry);
          pEntry = pcVar2;
        } while (pcVar2 != (char *)0x0);
        if (p->vCutsNew->nSize <= Node) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        p->vCutsNew->pArray[(uint)Node] = pcVar1;
      }
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Cut_OracleFreeCuts( Cut_Oracle_t * p, int Node )
{
    Cut_Cut_t * pList, * pCut, * pCut2;
    pList = (Cut_Cut_t *)Vec_PtrEntry( p->vCutsNew, Node );
    if ( pList == NULL )
        return;
    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
        Extra_MmFixedEntryRecycle( p->pMmCuts, (char *)pCut );
    Vec_PtrWriteEntry( p->vCutsNew, Node, pList );
}